

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

int Mf_CutRef_rec(Mf_Man_t *p,int *pCut)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  
  iVar1 = Mf_CutArea(p,*pCut & 0x1f,(uint)*pCut >> 5);
  for (uVar4 = 1; uVar4 <= (*pCut & 0x1f); uVar4 = uVar4 + 1) {
    iVar2 = Mf_ObjMapRefInc(p,pCut[uVar4]);
    if ((iVar2 == 0) && (p->pLfObjs[pCut[uVar4]].iCutSet != 0)) {
      piVar3 = Mf_ObjCutSet(p,pCut[uVar4]);
      iVar2 = Mf_CutRef_rec(p,piVar3 + 1);
      iVar1 = iVar1 + iVar2;
    }
  }
  return iVar1;
}

Assistant:

int Mf_CutRef_rec( Mf_Man_t * p, int * pCut )
{
    int i, Count = Mf_CutArea(p, Mf_CutSize(pCut), Mf_CutFunc(pCut));
    for ( i = 1; i <= Mf_CutSize(pCut); i++ )
        if ( !Mf_ObjMapRefInc(p, pCut[i]) && Mf_ManObj(p, pCut[i])->iCutSet )
            Count += Mf_CutRef_rec( p, Mf_ObjCutBest(p, pCut[i]) );
    return Count;
}